

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O1

bool LEARNER::complete_multi_ex(example *ec,multi_ex *ec_seq,vw *all)

{
  pointer *pppeVar1;
  iterator __position;
  wclass *pwVar2;
  bool bVar3;
  bool bVar4;
  example *local_18;
  
  local_18 = ec;
  bVar4 = (*(all->p->lp).test_label)(&ec->l);
  bVar3 = true;
  if (((local_18->tag)._end == (local_18->tag)._begin) &&
     ((local_18->super_example_predict).indices._end ==
      (local_18->super_example_predict).indices._begin)) {
    pwVar2 = (local_18->l).cs.costs._begin;
    if ((long)(local_18->l).cs.costs._end - (long)pwVar2 == 0x10) {
      bVar3 = pwVar2->partial_prediction == -1.0;
    }
    else {
      bVar3 = false;
    }
  }
  if ((bVar3) || (!bVar4)) {
    __position._M_current =
         (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<example*,std::allocator<example*>>::_M_realloc_insert<example*const&>
                ((vector<example*,std::allocator<example*>> *)ec_seq,__position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      pppeVar1 = &(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppeVar1 = *pppeVar1 + 1;
    }
  }
  else {
    VW::finish_example(all,local_18);
    if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Something is wrong---an example with no choice.  Do you have all 0 features? Or multiple empty lines?"
               ,0x65);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool complete_multi_ex(example* ec, multi_ex& ec_seq, vw& all)
{
  const bool is_test_ec = all.p->lp.test_label(&ec->l);

  if (example_is_newline_not_header(*ec) && is_test_ec)
  {
    VW::finish_example(all, *ec);
    if (ec_seq.size() == 0)
    {
      cout << "Something is wrong---an example with no choice.  Do you have all 0 features? Or multiple empty lines?"
           << endl;
      return false;
    }
    return true;  // example complete
  }
  ec_seq.push_back(ec);
  return false;
}